

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

char * afm_stream_read_one(AFM_Stream stream)

{
  byte *pbVar1;
  uint local_28;
  int ch;
  char *str;
  AFM_Stream stream_local;
  
  afm_stream_skip_spaces(stream);
  if (stream->status < 1) {
    stream_local = (AFM_Stream)(stream->cursor + -1);
    do {
      if (stream->cursor < stream->limit) {
        pbVar1 = stream->cursor;
        stream->cursor = pbVar1 + 1;
        local_28 = (uint)*pbVar1;
      }
      else {
        local_28 = 0xffffffff;
      }
      if (local_28 == 0x20) {
        return (char *)stream_local;
      }
      if (local_28 == 9) {
        return (char *)stream_local;
      }
      if ((local_28 == 0xd) || (local_28 == 10)) {
        stream->status = 2;
        return (char *)stream_local;
      }
      if (local_28 == 0x3b) {
        stream->status = 1;
        return (char *)stream_local;
      }
    } while ((local_28 != 0xffffffff) && (local_28 != 0x1a));
    stream->status = 3;
  }
  else {
    stream_local = (AFM_Stream)0x0;
  }
  return (char *)stream_local;
}

Assistant:

static char*
  afm_stream_read_one( AFM_Stream  stream )
  {
    char*  str;


    afm_stream_skip_spaces( stream );
    if ( AFM_STATUS_EOC( stream ) )
      return NULL;

    str = AFM_STREAM_KEY_BEGIN( stream );

    while ( 1 )
    {
      int  ch = AFM_GETC();


      if ( AFM_IS_SPACE( ch ) )
        break;
      else if ( AFM_IS_NEWLINE( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOL;
        break;
      }
      else if ( AFM_IS_SEP( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOC;
        break;
      }
      else if ( AFM_IS_EOF( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOF;
        break;
      }
    }

    return str;
  }